

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::AssertionHandler::handleExpr<acto::actor_ref_const&>
          (AssertionHandler *this,ExprLhs<const_acto::actor_ref_&> *expr)

{
  UnaryExpr<const_acto::actor_ref_&> UStack_28;
  
  ExprLhs<const_acto::actor_ref_&>::makeUnaryExpr(&UStack_28,expr);
  handleExpr(this,&UStack_28.super_ITransientExpression);
  ITransientExpression::~ITransientExpression(&UStack_28.super_ITransientExpression);
  return;
}

Assistant:

void handleExpr( ExprLhs<T> const& expr ) {
            handleExpr( expr.makeUnaryExpr() );
        }